

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O3

bool stackjit::fromString(string *str,AccessModifier *accessModifier)

{
  int iVar1;
  AccessModifier AVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)str);
  AVar2 = Public;
  if (iVar1 != 0) {
    iVar1 = std::__cxx11::string::compare((char *)str);
    AVar2 = Private;
    if (iVar1 != 0) {
      return false;
    }
  }
  *accessModifier = AVar2;
  return true;
}

Assistant:

bool fromString(std::string str, AccessModifier& accessModifier) {
		if (str == "public") {
			accessModifier = AccessModifier::Public;
			return true;
		} else if (str == "private") {
			accessModifier = AccessModifier::Private;
			return true;
		}

		return false;
	}